

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

void __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
          (SquareMatrix<std::complex<double>_> *this,SquareMatrix<std::complex<double>_> *matrix)

{
  int64_t iVar1;
  complex<double> *pcVar2;
  type pcVar3;
  size_t local_38;
  int64_t i;
  complex<double> *data;
  SquareMatrix<std::complex<double>_> *matrix_local;
  SquareMatrix<std::complex<double>_> *this_local;
  
  iVar1 = size(matrix);
  this->size_ = iVar1;
  alloc_unique_array<std::complex<double>>((dense *)&this->data_,this->size_ * this->size_);
  pcVar2 = ptr(matrix);
  for (local_38 = 0; (long)local_38 < this->size_ * this->size_; local_38 = local_38 + 1) {
    pcVar3 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
             operator[](&this->data_,local_38);
    *(undefined8 *)pcVar3->_M_value = *(undefined8 *)pcVar2[local_38]._M_value;
    *(undefined8 *)(pcVar3->_M_value + 8) = *(undefined8 *)(pcVar2[local_38]._M_value + 8);
  }
  return;
}

Assistant:

SquareMatrix( const SquareMatrix< T >& matrix )
        : size_( matrix.size() )
        , data_( alloc_unique_array< T >( size_ * size_ ) )
        {
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
        }